

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int quicly_retry_calc_cidpair_hash
              (ptls_hash_algorithm_t *sha256,ptls_iovec_t client_cid,ptls_iovec_t server_cid,
              uint64_t *value)

{
  int iVar1;
  size_t __n;
  uint8_t buf [42];
  uint8_t digest [32];
  undefined1 local_88;
  undefined1 local_87 [47];
  ulong local_58 [5];
  
  __n = client_cid.len;
  local_88 = (undefined1)client_cid.len;
  memcpy(local_87,client_cid.base,__n);
  local_87[__n] = (char)server_cid.len;
  memcpy(local_87 + __n + 1,server_cid.base,server_cid.len);
  iVar1 = ptls_calc_hash(sha256,local_58,&local_88,server_cid.len + __n + 2);
  if (iVar1 == 0) {
    *value = local_58[0] >> 0x38 | (local_58[0] & 0xff000000000000) >> 0x28 |
             (local_58[0] & 0xff0000000000) >> 0x18 | (local_58[0] & 0xff00000000) >> 8 |
             (local_58[0] & 0xff000000) << 8 | (local_58[0] & 0xff0000) << 0x18 |
             (local_58[0] & 0xff00) << 0x28 | local_58[0] << 0x38;
  }
  return iVar1;
}

Assistant:

int quicly_retry_calc_cidpair_hash(ptls_hash_algorithm_t *sha256, ptls_iovec_t client_cid, ptls_iovec_t server_cid, uint64_t *value)
{
    uint8_t digest[PTLS_SHA256_DIGEST_SIZE], buf[(QUICLY_MAX_CID_LEN_V1 + 1) * 2], *p = buf;
    int ret;

    *p++ = (uint8_t)client_cid.len;
    memcpy(p, client_cid.base, client_cid.len);
    p += client_cid.len;
    *p++ = (uint8_t)server_cid.len;
    memcpy(p, server_cid.base, server_cid.len);
    p += server_cid.len;

    if ((ret = ptls_calc_hash(sha256, digest, buf, p - buf)) != 0)
        return ret;
    p = digest;
    *value = quicly_decode64((void *)&p);

    return 0;
}